

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.h
# Opt level: O1

bool __thiscall
bidirectional::BiDirectional::checkPrimalBound
          (BiDirectional *this,Directions *direction,Label *candidate_label)

{
  bool bVar1;
  
  if ((((this->params_ptr_)._M_t.
        super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>.
        _M_t.
        super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
        .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl)->bounds_pruning != true
      ) || (bVar1 = true,
           candidate_label->weight +
           *(double *)
            (**(long **)((long)(&this->fwd_search_ptr_)[*direction != FWD]._M_t.
                               super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                               .super__Head_base<0UL,_bidirectional::Search_*,_false> + 0x18) +
            (long)(candidate_label->vertex).lemon_id * 8) <= this->primal_st_bound_)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

Search* getSearchPtr(Directions direction) {
    if (direction == FWD)
      return fwd_search_ptr_.get();
    return bwd_search_ptr_.get();
  }